

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printNasmStats(Stats *stats)

{
  ostream *poVar1;
  size_t sVar2;
  void *pvVar3;
  Stats *stats_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"#Jump = ");
  sVar2 = mocker::nasm::Stats::countJumps(stats);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"#insts = ");
  sVar2 = mocker::nasm::Stats::countInsts(stats);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"#MemOperation = ");
  sVar2 = mocker::nasm::Stats::countMemOperation(stats);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printNasmStats(const mocker::nasm::Stats &stats) {
  using namespace mocker::nasm;
  std::cerr << "#Jump = " << stats.countJumps() << std::endl;
  std::cerr << "#insts = " << stats.countInsts() << std::endl;
  std::cerr << "#MemOperation = " << stats.countMemOperation() << std::endl;
}